

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void newBinGE(IntView<0> x,IntView<0> y,BoolView *r)

{
  IntView<0> _y;
  IntView<0> _y_00;
  IntView<4> _y_01;
  IntView<4> _y_02;
  IntView<1> _y_03;
  IntView<1> _y_04;
  IntView<5> _y_05;
  IntView<5> _y_06;
  IntView<0> _y_07;
  IntView<0> _y_08;
  IntView<0> _y_09;
  IntView<0> _y_10;
  IntView<0> _x;
  IntView<0> _x_00;
  IntView<0> _x_01;
  IntView<0> _x_02;
  IntView<0> _x_03;
  IntView<0> _x_04;
  IntView<0> _x_05;
  IntView<0> _x_06;
  IntView<1> _x_07;
  IntView<1> _x_08;
  IntView<5> _x_09;
  IntView<5> _x_10;
  bool bVar1;
  IntVar *pIVar2;
  void *pvVar3;
  IntVar *in_RCX;
  IntVar *in_RDX;
  undefined8 in_RSI;
  IntVar *in_RDI;
  Propagator *p;
  int v;
  int u;
  BoolView *in_stack_fffffffffffffbf8;
  BoolView *in_stack_fffffffffffffc00;
  IntVar *in_stack_fffffffffffffc28;
  BinGE<1,_0,_0> *in_stack_fffffffffffffc30;
  IntVar *in_stack_fffffffffffffc38;
  undefined1 *in_stack_fffffffffffffc40;
  IntVar *in_stack_fffffffffffffc48;
  undefined1 *in_stack_fffffffffffffc50;
  BoolView local_328;
  IntVar *local_318;
  IntVar *pIStack_310;
  IntView<5> local_300;
  undefined1 local_2e9;
  IntVar *local_2d8;
  IntVar *pIStack_2d0;
  IntView<5> local_2c0;
  undefined1 local_2a9;
  IntVar *local_298;
  IntVar *pIStack_290;
  IntView<1> local_280;
  undefined1 local_269;
  undefined1 local_268 [24];
  IntVar *pIStack_250;
  IntView<1> local_240;
  undefined1 local_229;
  undefined1 local_228 [16];
  IntView<5> local_218;
  IntVar *local_208;
  int iStack_200;
  int iStack_1fc;
  undefined1 local_1e9;
  undefined1 local_1e8 [16];
  IntView<5> local_1d8;
  IntVar *local_1c8;
  int iStack_1c0;
  int iStack_1bc;
  undefined1 local_1a9;
  IntView<1> local_198;
  IntVar *local_188;
  int iStack_180;
  int iStack_17c;
  undefined1 local_169;
  IntView<1> local_158;
  IntVar *local_148;
  int iStack_140;
  int iStack_13c;
  undefined1 local_129;
  IntView<4> local_118;
  IntVar *local_108;
  int iStack_100;
  int iStack_fc;
  undefined1 local_e9;
  IntView<4> local_d8;
  IntVar *local_c8;
  int iStack_c0;
  int iStack_bc;
  undefined1 local_a9;
  IntVar *local_98;
  IntVar *pIStack_90;
  IntVar *local_88;
  int iStack_80;
  int iStack_7c;
  undefined1 local_75;
  IntVar *local_58;
  IntVar *pIStack_50;
  IntVar *local_48;
  int iStack_40;
  int iStack_3c;
  IntVar *local_38;
  int local_30;
  int local_2c;
  undefined1 local_20 [16];
  IntView<0> local_10;
  
  local_20._0_8_ = in_RDX;
  local_20._8_8_ = in_RCX;
  local_10.var = in_RDI;
  local_10._8_8_ = in_RSI;
  local_2c = IntView<0>::getType(&local_10);
  local_30 = IntView<0>::getType((IntView<0> *)local_20);
  local_38 = (IntVar *)0x0;
  if ((local_2c == 0) && (local_30 == 0)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffc00);
    if (bVar1) {
      pIVar2 = (IntVar *)operator_new(0x48);
      local_75 = 1;
      local_48 = local_10.var;
      iStack_40 = local_10.a;
      iStack_3c = local_10.b;
      local_58 = (IntVar *)local_20._0_8_;
      pIStack_50 = (IntVar *)local_20._8_8_;
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x._8_8_ = in_stack_fffffffffffffc50;
      _x.var = in_stack_fffffffffffffc48;
      _y._8_8_ = in_stack_fffffffffffffc40;
      _y.var = in_stack_fffffffffffffc38;
      BinGE<0,_0,_0>::BinGE
                ((BinGE<0,_0,_0> *)in_stack_fffffffffffffc30,_x,_y,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_75 = 0;
      local_38 = pIVar2;
      BoolView::~BoolView((BoolView *)0x274d50);
    }
    else {
      pIVar2 = (IntVar *)operator_new(0x48);
      local_a9 = 1;
      local_88 = local_10.var;
      iStack_80 = local_10.a;
      iStack_7c = local_10.b;
      local_98 = (IntVar *)local_20._0_8_;
      pIStack_90 = (IntVar *)local_20._8_8_;
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_00._8_8_ = in_stack_fffffffffffffc50;
      _x_00.var = in_stack_fffffffffffffc48;
      _y_00._8_8_ = in_stack_fffffffffffffc40;
      _y_00.var = in_stack_fffffffffffffc38;
      BinGE<0,_0,_1>::BinGE
                ((BinGE<0,_0,_1> *)in_stack_fffffffffffffc30,_x_00,_y_00,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_a9 = 0;
      local_38 = pIVar2;
      BoolView::~BoolView((BoolView *)0x274e4f);
    }
  }
  if ((local_2c == 0) && (local_30 == 4)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffc00);
    if (bVar1) {
      pIVar2 = (IntVar *)operator_new(0x48);
      local_e9 = 1;
      local_c8 = local_10.var;
      iStack_c0 = local_10.a;
      iStack_bc = local_10.b;
      IntView<4>::IntView<0>(&local_d8,(IntView<0> *)local_20);
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_01._8_8_ = in_stack_fffffffffffffc50;
      _x_01.var = in_stack_fffffffffffffc48;
      _y_01._8_8_ = in_stack_fffffffffffffc40;
      _y_01.var = in_stack_fffffffffffffc38;
      BinGE<0,_4,_0>::BinGE
                ((BinGE<0,_4,_0> *)in_stack_fffffffffffffc30,_x_01,_y_01,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_e9 = 0;
      local_38 = pIVar2;
      BoolView::~BoolView((BoolView *)0x274f7e);
    }
    else {
      pIVar2 = (IntVar *)operator_new(0x48);
      local_129 = 1;
      local_108 = local_10.var;
      iStack_100 = local_10.a;
      iStack_fc = local_10.b;
      IntView<4>::IntView<0>(&local_118,(IntView<0> *)local_20);
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_02._8_8_ = in_stack_fffffffffffffc50;
      _x_02.var = in_stack_fffffffffffffc48;
      _y_02._8_8_ = in_stack_fffffffffffffc40;
      _y_02.var = in_stack_fffffffffffffc38;
      BinGE<0,_4,_1>::BinGE
                ((BinGE<0,_4,_1> *)in_stack_fffffffffffffc30,_x_02,_y_02,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_129 = 0;
      local_38 = pIVar2;
      BoolView::~BoolView((BoolView *)0x275092);
    }
  }
  if ((local_2c == 0) && (local_30 == 1)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffc00);
    if (bVar1) {
      pIVar2 = (IntVar *)operator_new(0x48);
      local_169 = 1;
      local_148 = local_10.var;
      iStack_140 = local_10.a;
      iStack_13c = local_10.b;
      IntView<1>::IntView<0>(&local_158,(IntView<0> *)local_20);
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_03._8_8_ = in_stack_fffffffffffffc50;
      _x_03.var = in_stack_fffffffffffffc48;
      _y_03._8_8_ = in_stack_fffffffffffffc40;
      _y_03.var = in_stack_fffffffffffffc38;
      BinGE<0,_1,_0>::BinGE
                ((BinGE<0,_1,_0> *)in_stack_fffffffffffffc30,_x_03,_y_03,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_169 = 0;
      local_38 = pIVar2;
      BoolView::~BoolView((BoolView *)0x2751d1);
    }
    else {
      pIVar2 = (IntVar *)operator_new(0x48);
      local_1a9 = 1;
      local_188 = local_10.var;
      iStack_180 = local_10.a;
      iStack_17c = local_10.b;
      IntView<1>::IntView<0>(&local_198,(IntView<0> *)local_20);
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_04._8_8_ = in_stack_fffffffffffffc50;
      _x_04.var = in_stack_fffffffffffffc48;
      _y_04._8_8_ = in_stack_fffffffffffffc40;
      _y_04.var = in_stack_fffffffffffffc38;
      BinGE<0,_1,_1>::BinGE
                ((BinGE<0,_1,_1> *)in_stack_fffffffffffffc30,_x_04,_y_04,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_1a9 = 0;
      local_38 = pIVar2;
      BoolView::~BoolView((BoolView *)0x2752d6);
    }
  }
  if ((local_2c == 0) && (local_30 == 5)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffc00);
    if (bVar1) {
      pIVar2 = (IntVar *)operator_new(0x48);
      local_1e9 = 1;
      local_1c8 = local_10.var;
      iStack_1c0 = local_10.a;
      iStack_1bc = local_10.b;
      IntView<5>::IntView<0>(&local_1d8,(IntView<0> *)local_20);
      in_stack_fffffffffffffc50 = local_1e8;
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_05._8_8_ = in_stack_fffffffffffffc50;
      _x_05.var = in_stack_fffffffffffffc48;
      _y_05._8_8_ = in_stack_fffffffffffffc40;
      _y_05.var = in_stack_fffffffffffffc38;
      BinGE<0,_5,_0>::BinGE
                ((BinGE<0,_5,_0> *)in_stack_fffffffffffffc30,_x_05,_y_05,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_1e9 = 0;
      local_38 = pIVar2;
      BoolView::~BoolView((BoolView *)0x275409);
    }
    else {
      in_stack_fffffffffffffc48 = (IntVar *)operator_new(0x48);
      local_229 = 1;
      local_208 = local_10.var;
      iStack_200 = local_10.a;
      iStack_1fc = local_10.b;
      IntView<5>::IntView<0>(&local_218,(IntView<0> *)local_20);
      in_stack_fffffffffffffc40 = local_228;
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_06._8_8_ = in_stack_fffffffffffffc50;
      _x_06.var = in_stack_fffffffffffffc48;
      _y_06._8_8_ = in_stack_fffffffffffffc40;
      _y_06.var = in_stack_fffffffffffffc38;
      BinGE<0,_5,_1>::BinGE
                ((BinGE<0,_5,_1> *)in_stack_fffffffffffffc30,_x_06,_y_06,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_229 = 0;
      local_38 = in_stack_fffffffffffffc48;
      BoolView::~BoolView((BoolView *)0x27550b);
    }
  }
  if ((local_2c == 1) && (local_30 == 0)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffc00);
    if (bVar1) {
      in_stack_fffffffffffffc38 = (IntVar *)operator_new(0x48);
      local_269 = 1;
      IntView<1>::IntView<0>(&local_240,&local_10);
      local_268._16_8_ = local_20._0_8_;
      pIStack_250 = (IntVar *)local_20._8_8_;
      in_stack_fffffffffffffc30 = (BinGE<1,_0,_0> *)local_268;
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_07._8_8_ = in_stack_fffffffffffffc50;
      _x_07.var = in_stack_fffffffffffffc48;
      _y_07._8_8_ = in_stack_fffffffffffffc40;
      _y_07.var = in_stack_fffffffffffffc38;
      BinGE<1,_0,_0>::BinGE
                (in_stack_fffffffffffffc30,_x_07,_y_07,(BoolView *)in_stack_fffffffffffffc28);
      local_269 = 0;
      local_38 = in_stack_fffffffffffffc38;
      BoolView::~BoolView((BoolView *)0x27563e);
    }
    else {
      in_stack_fffffffffffffc28 = (IntVar *)operator_new(0x48);
      local_2a9 = 1;
      IntView<1>::IntView<0>(&local_280,&local_10);
      local_298 = (IntVar *)local_20._0_8_;
      pIStack_290 = (IntVar *)local_20._8_8_;
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_08._8_8_ = in_stack_fffffffffffffc50;
      _x_08.var = in_stack_fffffffffffffc48;
      _y_08._8_8_ = in_stack_fffffffffffffc40;
      _y_08.var = in_stack_fffffffffffffc38;
      BinGE<1,_0,_1>::BinGE
                ((BinGE<1,_0,_1> *)in_stack_fffffffffffffc30,_x_08,_y_08,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_2a9 = 0;
      local_38 = in_stack_fffffffffffffc28;
      BoolView::~BoolView((BoolView *)0x275740);
    }
  }
  if ((local_2c == 5) && (local_30 == 0)) {
    bVar1 = BoolView::isTrue(in_stack_fffffffffffffc00);
    if (bVar1) {
      pvVar3 = operator_new(0x48);
      local_2e9 = 1;
      IntView<5>::IntView<0>(&local_2c0,&local_10);
      local_2d8 = (IntVar *)local_20._0_8_;
      pIStack_2d0 = (IntVar *)local_20._8_8_;
      BoolView::BoolView(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      _x_09._8_8_ = in_stack_fffffffffffffc50;
      _x_09.var = in_stack_fffffffffffffc48;
      _y_09._8_8_ = in_stack_fffffffffffffc40;
      _y_09.var = in_stack_fffffffffffffc38;
      BinGE<5,_0,_0>::BinGE
                ((BinGE<5,_0,_0> *)in_stack_fffffffffffffc30,_x_09,_y_09,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_2e9 = 0;
      local_38 = (IntVar *)pvVar3;
      BoolView::~BoolView((BoolView *)0x275873);
    }
    else {
      pvVar3 = operator_new(0x48);
      IntView<5>::IntView<0>(&local_300,&local_10);
      local_318 = (IntVar *)local_20._0_8_;
      pIStack_310 = (IntVar *)local_20._8_8_;
      BoolView::BoolView(&local_328,in_stack_fffffffffffffbf8);
      _x_10._8_8_ = in_stack_fffffffffffffc50;
      _x_10.var = in_stack_fffffffffffffc48;
      _y_10._8_8_ = in_stack_fffffffffffffc40;
      _y_10.var = in_stack_fffffffffffffc38;
      BinGE<5,_0,_1>::BinGE
                ((BinGE<5,_0,_1> *)in_stack_fffffffffffffc30,_x_10,_y_10,
                 (BoolView *)in_stack_fffffffffffffc28);
      local_38 = (IntVar *)pvVar3;
      BoolView::~BoolView((BoolView *)0x275975);
    }
  }
  return;
}

Assistant:

void newBinGE(IntView<> x, IntView<> y, const BoolView& r = bv_true) {
	const int u = x.getType();
	const int v = y.getType();
	Propagator* p = nullptr;

	BinProp(BinGE, 0, 0);
	BinProp(BinGE, 0, 4);
	BinProp(BinGE, 0, 1);
	BinProp(BinGE, 0, 5);
	BinProp(BinGE, 1, 0);
	BinProp(BinGE, 5, 0);

	assert(p);
}